

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassConfidenceThresholdingValidator.cpp
# Opt level: O1

Result * CoreML::validate<(MLModelType)560>(Result *__return_storage_ptr__,Model *format)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  bool bVar5;
  Type *pTVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  int index;
  undefined1 *puVar10;
  Result result;
  RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve> precisionrecallcurves;
  undefined1 local_98 [8];
  _Alloc_hider local_90;
  undefined1 local_88 [24];
  pointer local_70;
  _Alloc_hider local_68;
  size_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  RepeatedPtrFieldBase local_48;
  
  puVar10 = (undefined1 *)format->description_;
  if ((ModelDescription *)puVar10 == (ModelDescription *)0x0) {
    puVar10 = Specification::_ModelDescription_default_instance_;
  }
  Result::Result((Result *)&local_70);
  local_48.arena_ = (Arena *)((ulong)local_48.arena_._4_4_ << 0x20);
  validateModelDescription
            ((Result *)local_98,(ModelDescription *)puVar10,format->specificationversion_,
             (ValidationPolicy *)&local_48);
  local_70 = (pointer)local_98;
  std::__cxx11::string::operator=((string *)&local_68,(string *)&local_90);
  if (local_90._M_p != local_88 + 8) {
    operator_delete(local_90._M_p,local_88._8_8_ + 1);
  }
  bVar5 = Result::good((Result *)&local_70);
  if (bVar5) {
    if (format->_oneof_case_[0] == 0x230) {
      puVar10 = (undefined1 *)(format->Type_).pipeline_;
    }
    else {
      puVar10 = Specification::_ClassConfidenceThresholding_default_instance_;
    }
    local_48.arena_ = (Arena *)0x0;
    local_48.current_size_ = 0;
    local_48.total_size_ = 0;
    local_48.rep_ = (Rep *)0x0;
    google::protobuf::internal::RepeatedPtrFieldBase::
    MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve>::TypeHandler>
              (&local_48,&(((Pipeline *)puVar10)->models_).super_RepeatedPtrFieldBase);
    iVar4 = local_48.current_size_;
    if (local_48.current_size_ < 1) {
      local_98 = (undefined1  [8])local_88;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_98,
                 "The ClassConfidenceThresholding model has no precisionRecallCurves.","");
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_98);
LAB_003002f6:
      if (local_98 != (undefined1  [8])local_88) {
        operator_delete((void *)local_98,local_88._0_8_ + 1);
      }
    }
    else {
      index = 0;
      do {
        pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve>::TypeHandler>
                           (&local_48,index);
        puVar10 = (undefined1 *)pTVar6->precisionvalues_;
        if ((FloatVector *)puVar10 == (FloatVector *)0x0) {
          puVar10 = Specification::_FloatVector_default_instance_;
        }
        iVar2 = (((FloatVector *)puVar10)->vector_).current_size_;
        pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve>::TypeHandler>
                           (&local_48,index);
        puVar10 = (undefined1 *)pTVar6->precisionconfidencethresholds_;
        if ((FloatVector *)puVar10 == (FloatVector *)0x0) {
          puVar10 = Specification::_FloatVector_default_instance_;
        }
        if ((iVar2 == 0) || (iVar2 != (((FloatVector *)puVar10)->vector_).current_size_)) {
          local_98 = (undefined1  [8])local_88;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_98,"Zero length or mismatched precisionRecallCurves components"
                     ,"");
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_98);
          goto LAB_003002f6;
        }
        pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve>::TypeHandler>
                           (&local_48,index);
        puVar10 = (undefined1 *)pTVar6->recallvalues_;
        if ((FloatVector *)puVar10 == (FloatVector *)0x0) {
          puVar10 = Specification::_FloatVector_default_instance_;
        }
        iVar2 = (((FloatVector *)puVar10)->vector_).current_size_;
        pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve>::TypeHandler>
                           (&local_48,index);
        puVar10 = (undefined1 *)pTVar6->recallconfidencethresholds_;
        if ((FloatVector *)puVar10 == (FloatVector *)0x0) {
          puVar10 = Specification::_FloatVector_default_instance_;
        }
        if ((iVar2 == 0) || (iVar2 != (((FloatVector *)puVar10)->vector_).current_size_)) {
          local_98 = (undefined1  [8])local_88;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_98,"Zero length or mismatched precisionRecallCurves components"
                     ,"");
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_98);
          goto LAB_003002f6;
        }
        pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve>::TypeHandler>
                           (&local_48,index);
        puVar10 = (undefined1 *)pTVar6->precisionvalues_;
        if ((FloatVector *)puVar10 == (FloatVector *)0x0) {
          puVar10 = Specification::_FloatVector_default_instance_;
        }
        lVar7 = (long)(((FloatVector *)puVar10)->vector_).current_size_;
        if (lVar7 != 0) {
          lVar8 = 0;
          do {
            uVar3 = *(uint *)((long)(((FloatVector *)puVar10)->vector_).arena_or_elements_ + lVar8);
            uVar9 = uVar3 & 0x7fffffff;
            if ((0x7f7fffff < uVar9 || uVar9 - 1 < 0x7fffff && (int)uVar3 < 0) ||
                uVar9 - 0x800000 < 0x7f000000 && (int)uVar3 < 0) {
              local_98 = (undefined1  [8])local_88;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_98,
                         "An element of precisionvalues is not a positive number or zero.","");
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_98);
              goto LAB_003002f6;
            }
            lVar8 = lVar8 + 4;
          } while (lVar7 * 4 != lVar8);
        }
        pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve>::TypeHandler>
                           (&local_48,index);
        puVar10 = (undefined1 *)pTVar6->precisionconfidencethresholds_;
        if ((FloatVector *)puVar10 == (FloatVector *)0x0) {
          puVar10 = Specification::_FloatVector_default_instance_;
        }
        lVar7 = (long)(((FloatVector *)puVar10)->vector_).current_size_;
        if (lVar7 != 0) {
          lVar8 = 0;
          do {
            uVar3 = *(uint *)((long)(((FloatVector *)puVar10)->vector_).arena_or_elements_ + lVar8);
            uVar9 = uVar3 & 0x7fffffff;
            if ((0x7f7fffff < uVar9 || uVar9 - 1 < 0x7fffff && (int)uVar3 < 0) ||
                uVar9 - 0x800000 < 0x7f000000 && (int)uVar3 < 0) {
              local_98 = (undefined1  [8])local_88;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_98,
                         "An element of precisionconfidencethresholds is not a positive number or zero."
                         ,"");
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_98);
              goto LAB_003002f6;
            }
            lVar8 = lVar8 + 4;
          } while (lVar7 * 4 != lVar8);
        }
        pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve>::TypeHandler>
                           (&local_48,index);
        puVar10 = (undefined1 *)pTVar6->recallvalues_;
        if ((FloatVector *)puVar10 == (FloatVector *)0x0) {
          puVar10 = Specification::_FloatVector_default_instance_;
        }
        lVar7 = (long)(((FloatVector *)puVar10)->vector_).current_size_;
        if (lVar7 != 0) {
          lVar8 = 0;
          do {
            uVar3 = *(uint *)((long)(((FloatVector *)puVar10)->vector_).arena_or_elements_ + lVar8);
            uVar9 = uVar3 & 0x7fffffff;
            if ((0x7f7fffff < uVar9 || uVar9 - 1 < 0x7fffff && (int)uVar3 < 0) ||
                uVar9 - 0x800000 < 0x7f000000 && (int)uVar3 < 0) {
              local_98 = (undefined1  [8])local_88;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_98,
                         "An element of recallvalues is not a positive number or zero.","");
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_98);
              goto LAB_003002f6;
            }
            lVar8 = lVar8 + 4;
          } while (lVar7 * 4 != lVar8);
        }
        pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve>::TypeHandler>
                           (&local_48,index);
        puVar10 = (undefined1 *)pTVar6->recallconfidencethresholds_;
        if ((FloatVector *)puVar10 == (FloatVector *)0x0) {
          puVar10 = Specification::_FloatVector_default_instance_;
        }
        lVar7 = (long)(((FloatVector *)puVar10)->vector_).current_size_;
        if (lVar7 != 0) {
          lVar8 = 0;
          do {
            uVar3 = *(uint *)((long)(((FloatVector *)puVar10)->vector_).arena_or_elements_ + lVar8);
            uVar9 = uVar3 & 0x7fffffff;
            if ((0x7f7fffff < uVar9 || uVar9 - 1 < 0x7fffff && (int)uVar3 < 0) ||
                uVar9 - 0x800000 < 0x7f000000 && (int)uVar3 < 0) {
              local_98 = (undefined1  [8])local_88;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_98,
                         "An element of recallconfidencethresholds is not a positive number or zero."
                         ,"");
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_98);
              goto LAB_003002f6;
            }
            lVar8 = lVar8 + 4;
          } while (lVar7 * 4 != lVar8);
        }
        index = index + 1;
      } while (index != iVar4);
      Result::Result(__return_storage_ptr__);
    }
    google::protobuf::RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve>::
    ~RepeatedPtrField((RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve> *)&local_48);
  }
  else {
    *(pointer *)__return_storage_ptr__ = local_70;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_p == &local_58) {
      paVar1->_M_allocated_capacity =
           CONCAT71(local_58._M_allocated_capacity._1_7_,local_58._M_local_buf[0]);
      *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_58._8_8_;
    }
    else {
      (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_68._M_p;
      (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
           CONCAT71(local_58._M_allocated_capacity._1_7_,local_58._M_local_buf[0]);
    }
    (__return_storage_ptr__->m_message)._M_string_length = local_60;
    local_60 = 0;
    local_58._M_local_buf[0] = '\0';
    local_68._M_p = (pointer)&local_58;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_p != &local_58) {
    operator_delete(local_68._M_p,
                    CONCAT71(local_58._M_allocated_capacity._1_7_,local_58._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_classConfidenceThresholding>(const Specification::Model& format) {
        const auto& interface = format.description();
        Result result;

        result = validateModelDescription(interface, format.specificationversion());
        if (!result.good()) {
            return result;
        }

        // validate precisionRecallCurves
        google::protobuf::RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve> precisionrecallcurves =
                format.classconfidencethresholding().precisionrecallcurves();
        int nCurves = precisionrecallcurves.size();
        if (nCurves > 0) {
            for (int i = 0; i < nCurves; ++i) {
                int precisionvaluesElts = precisionrecallcurves.Get(i).precisionvalues().vector().size();
                int precisionthreshElts = precisionrecallcurves.Get(i).precisionconfidencethresholds().vector().size();
                if (0 == precisionvaluesElts || precisionvaluesElts != precisionthreshElts) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, "Zero length or mismatched precisionRecallCurves components");
                }
                
                int recallvaluesElts = precisionrecallcurves.Get(i).recallvalues().vector().size();
                int recallthreshElts = precisionrecallcurves.Get(i).recallconfidencethresholds().vector().size();
                if (0 == recallvaluesElts || recallvaluesElts != recallthreshElts) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, "Zero length or mismatched precisionRecallCurves components");
                }
                            
                for (auto elt : precisionrecallcurves.Get(i).precisionvalues().vector()) {
                    if (std::isinf(elt) || std::isnan(elt) || elt < 0.0f) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, "An element of precisionvalues is not a positive number or zero.");
                    }
                }
                
                for (auto elt : precisionrecallcurves.Get(i).precisionconfidencethresholds().vector()) {
                    if (std::isinf(elt) || std::isnan(elt) || elt < 0.0f) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, "An element of precisionconfidencethresholds is not a positive number or zero.");
                    }
                }
                
                for (auto elt : precisionrecallcurves.Get(i).recallvalues().vector()) {
                    if (std::isinf(elt) || std::isnan(elt) || elt < 0.0f) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, "An element of recallvalues is not a positive number or zero.");
                    }
                }
                
                for (auto elt : precisionrecallcurves.Get(i).recallconfidencethresholds().vector()) {
                    if (std::isinf(elt) || std::isnan(elt) || elt < 0.0f) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, "An element of recallconfidencethresholds is not a positive number or zero.");
                    }
                }
            }
            return Result();
        } else {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "The ClassConfidenceThresholding model has no precisionRecallCurves.");
        }
    }